

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_after_RFQ_toggle_only_results_in_the_edition_number_being_reused_Test
::TestBody(SubjectSetRegisterTest_next_subscription_sync_after_RFQ_toggle_only_results_in_the_edition_number_being_reused_Test
           *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_1e8;
  Message local_1e0;
  uint local_1d8;
  uint local_1d4;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> message2;
  undefined1 local_138 [8];
  optional<bidfx_public_api::price::pixie::SubscriptionSync> message1;
  Subject local_b8 [24];
  SubjectSetRegister local_a0 [8];
  SubjectSetRegister subject_register;
  SubjectSetRegisterTest_next_subscription_sync_after_RFQ_toggle_only_results_in_the_edition_number_being_reused_Test
  *this_local;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_a0);
  bidfx_public_api::price::subject::Subject::Subject(local_b8,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_b8,0);
  subject::Subject::~Subject(local_b8);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)
             &message2.
              super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
              _M_payload.
              super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
              .super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>.
              _M_engaged,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register
            (local_a0,&message2.
                       super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>
                       ._M_payload.
                       super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
                       .
                       super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>
                       ._M_engaged,0);
  subject::Subject::~Subject
            ((Subject *)
             &message2.
              super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
              _M_payload.
              super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
              .super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>.
              _M_engaged);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator->
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)local_138);
  local_1d4 = bidfx_public_api::price::pixie::SubscriptionSync::GetEdition();
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator->
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar.message_);
  local_1d8 = bidfx_public_api::price::pixie::SubscriptionSync::GetEdition();
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_1d0,"message1->GetEdition()","message2->GetEdition()",
             &local_1d4,&local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x2b9,message);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar.message_);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)local_138);
  SubjectSetRegister::~SubjectSetRegister(local_a0);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_after_RFQ_toggle_only_results_in_the_edition_number_being_reused)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    std::optional<SubscriptionSync> message1 = subject_register.NextSubscriptionSync();

    subject_register.Unregister(SS_RFQ_SUBJECT3);
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    std::optional<SubscriptionSync> message2 = subject_register.NextSubscriptionSync();
    EXPECT_EQ(message1->GetEdition(), message2->GetEdition());
}